

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_NOURISH(effect_handler_context_t_conflict *context)

{
  byte bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  
  wVar2 = effect_calculate_value(context,false);
  if (3 < (uint)context->subtype) {
    return false;
  }
  wVar2 = wVar2 * (uint)z_info->food_value;
  switch(context->subtype) {
  case 0:
    wVar3 = L'\0';
    if (L'\0' < wVar2) {
      wVar3 = wVar2;
    }
    bVar1 = true;
    if ((context->origin).what == SRC_PLAYER) {
      bVar1 = context->aware ^ 1;
    }
    player_inc_timed(player,L'\n',wVar3,false,(_Bool)bVar1,false);
    goto LAB_0013c787;
  case 1:
    wVar3 = L'\0';
    if (L'\0' < wVar2) {
      wVar3 = wVar2;
    }
    bVar1 = true;
    if ((context->origin).what == SRC_PLAYER) {
      bVar1 = context->aware ^ 1;
    }
    player_dec_timed(player,L'\n',wVar3,false,(_Bool)bVar1);
    goto LAB_0013c787;
  case 2:
    if (wVar2 < player->timed[10]) {
      msg("You vomit!");
    }
    wVar3 = L'\0';
    if (L'\0' < wVar2) {
      wVar3 = wVar2;
    }
    break;
  case 3:
    if (wVar2 <= player->timed[10]) goto LAB_0013c787;
    wVar3 = L'\xffffffff';
    if (L'\xffffffff' < wVar2) {
      wVar3 = wVar2;
    }
    wVar3 = wVar3 + L'\x01';
  }
  bVar1 = true;
  if ((context->origin).what == SRC_PLAYER) {
    bVar1 = context->aware ^ 1;
  }
  player_set_timed(player,L'\n',wVar3,false,(_Bool)bVar1);
LAB_0013c787:
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_NOURISH(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	amount *= z_info->food_value;
	if (context->subtype == 0) {
		/* Increase food level by amount */
		player_inc_timed(player, TMD_FOOD, MAX(amount, 0), false,
			context->origin.what != SRC_PLAYER || !context->aware,
			false);
	} else if (context->subtype == 1) {
		/* Decrease food level by amount */
		player_dec_timed(player, TMD_FOOD, MAX(amount, 0), false,
			context->origin.what != SRC_PLAYER || !context->aware);
	} else if (context->subtype == 2) {
		/* Set food level to amount, vomiting if necessary */
		bool message = player->timed[TMD_FOOD] > amount;
		if (message) {
			msg("You vomit!");
		}
		player_set_timed(player, TMD_FOOD, MAX(amount, 0), false,
			context->origin.what != SRC_PLAYER || !context->aware);
	} else if (context->subtype == 3) {
		/* Increase food level to amount if needed */
		if (player->timed[TMD_FOOD] < amount) {
			player_set_timed(player, TMD_FOOD, MAX(amount + 1, 0),
				false, context->origin.what != SRC_PLAYER
				|| !context->aware);
		}
	} else {
		return false;
	}
	context->ident = true;
	return true;
}